

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibPreprocess(Mio_Library_t *pLib,Vec_Int_t *vGateSizes,Vec_Wrd_t *vGateFuncs,
                      Vec_Wec_t *vGateCnfs,Vec_Ptr_t *vGateHands)

{
  int iVar1;
  Mio_Gate_t *pGate;
  word wVar2;
  int nCapMin;
  
  iVar1 = Mio_LibraryReadGateNum(pLib);
  Vec_IntGrow(vGateSizes,iVar1);
  Vec_WrdGrow(vGateFuncs,iVar1);
  Vec_WecGrow(vGateCnfs,iVar1);
  vGateCnfs->nSize = iVar1;
  Vec_PtrGrow(vGateHands,iVar1);
  for (pGate = Mio_LibraryReadGates(pLib); pGate != (Mio_Gate_t *)0x0;
      pGate = Mio_GateReadNext(pGate)) {
    iVar1 = Mio_GateReadPinNum(pGate);
    Vec_IntPush(vGateSizes,iVar1);
    wVar2 = Mio_GateReadTruth(pGate);
    iVar1 = vGateFuncs->nSize;
    if (iVar1 == vGateFuncs->nCap) {
      nCapMin = iVar1 * 2;
      if (iVar1 < 0x10) {
        nCapMin = 0x10;
      }
      Vec_WrdGrow(vGateFuncs,nCapMin);
      iVar1 = vGateFuncs->nSize;
    }
    vGateFuncs->nSize = iVar1 + 1;
    vGateFuncs->pArray[iVar1] = wVar2;
    Mio_GateSetValue(pGate,vGateHands->nSize);
    Vec_PtrPush(vGateHands,pGate);
  }
  Sfm_DecCreateCnf(vGateSizes,vGateFuncs,vGateCnfs);
  return;
}

Assistant:

void Sfm_LibPreprocess( Mio_Library_t * pLib, Vec_Int_t * vGateSizes, Vec_Wrd_t * vGateFuncs, Vec_Wec_t * vGateCnfs, Vec_Ptr_t * vGateHands )
{
    Mio_Gate_t * pGate;
    int nGates = Mio_LibraryReadGateNum(pLib);
    Vec_IntGrow( vGateSizes, nGates );
    Vec_WrdGrow( vGateFuncs, nGates );
    Vec_WecInit( vGateCnfs,  nGates );
    Vec_PtrGrow( vGateHands, nGates );
    Mio_LibraryForEachGate( pLib, pGate )
    {
        Vec_IntPush( vGateSizes, Mio_GateReadPinNum(pGate) );
        Vec_WrdPush( vGateFuncs, Mio_GateReadTruth(pGate) );
        Mio_GateSetValue( pGate, Vec_PtrSize(vGateHands) );
        Vec_PtrPush( vGateHands, pGate );
    }
    Sfm_DecCreateCnf( vGateSizes, vGateFuncs, vGateCnfs );
}